

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::makeLvec(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_len,int p_row)

{
  int *piVar1;
  int iVar2;
  int size;
  int iVar3;
  
  iVar3 = (this->l).startSize;
  iVar2 = (this->l).firstUnused;
  if (iVar3 <= iVar2) {
    iVar3 = iVar3 + 100;
    (this->l).startSize = iVar3;
    spx_realloc<int*>(&(this->l).start,iVar3);
    iVar2 = (this->l).firstUnused;
  }
  piVar1 = (this->l).row;
  iVar3 = (this->l).start[iVar2];
  size = p_len + iVar3;
  minLMem(this,size);
  piVar1[(this->l).firstUnused] = p_row;
  iVar2 = (this->l).firstUnused;
  (this->l).firstUnused = iVar2 + 1;
  (this->l).start[(long)iVar2 + 1] = size;
  return iVar3;
}

Assistant:

int CLUFactor<R>::makeLvec(int p_len, int p_row)
{

   if(l.firstUnused >= l.startSize)
   {
      l.startSize += 100;
      spx_realloc(l.start, l.startSize);
   }

   int* p_lrow = l.row;

   int* p_lbeg = l.start;
   int first   = p_lbeg[l.firstUnused];

   assert(p_len > 0 && "ERROR: no empty columns allowed in L vectors");

   minLMem(first + p_len);
   p_lrow[l.firstUnused] = p_row;
   l.start[++(l.firstUnused)] = first + p_len;

   assert(l.start[l.firstUnused] <= l.size);
   assert(l.firstUnused <= l.startSize);
   return first;
}